

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringFormat.h
# Opt level: O2

basic_string<char,_std::char_traits<char>,_std::allocator<char>_> * __thiscall
rlib::string::format<char,std::__cxx11::string&>
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr__
          ,string *this,char *lpszFormat,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args)

{
  basic_format<char,_std::char_traits<char>,_std::allocator<char>_> format;
  allocator<char> local_121;
  string_type local_120;
  basic_format<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  
  boost::basic_format<char,_std::char_traits<char>,_std::allocator<char>_>::basic_format
            (&local_100,(char *)0x0);
  local_100.exceptions_ = '\0';
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_120,(char *)this,&local_121);
  boost::basic_format<char,_std::char_traits<char>,_std::allocator<char>_>::parse
            (&local_100,&local_120);
  std::__cxx11::string::~string((string *)&local_120);
  boost::io::detail::feed<char,std::char_traits<char>,std::allocator<char>,std::__cxx11::string&>
            (&local_100,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)lpszFormat);
  boost::basic_format<char,std::char_traits<char>,std::allocator<char>>::str_abi_cxx11_
            (__return_storage_ptr__,&local_100);
  boost::basic_format<char,_std::char_traits<char>,_std::allocator<char>_>::~basic_format
            (&local_100);
  return __return_storage_ptr__;
}

Assistant:

std::basic_string<CharT> format(const CharT* lpszFormat, Args&&... args) {
			boost::basic_format<CharT> format;
			format.exceptions(boost::io::no_error_bits);	// 例外を発生させない
			format.parse(lpszFormat);
			try {
				inner::f<CharT>(format, args...);
			} catch (...) {
			}
			return format.str();
		}